

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O2

string * format_error<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&>
                   (string *__return_storage_ptr__,Options *opt,char *type,SyntaxTree *context_,
                   char *msg,basic_string_view<char,_std::char_traits<char>_> *args)

{
  int iVar1;
  __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
  _Var2;
  weak_ptr<const_TokenStream> wVar3;
  shared_ptr<const_TokenStream> tstream;
  undefined1 local_70 [24];
  __shared_ptr<const_TokenStream,_(__gnu_cxx::_Lock_policy)2> local_58;
  TokenData local_48;
  
  if ((((context_->instream).super___shared_ptr<SyntaxTree::InputStream,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) || ((context_->token).begin == (context_->token).end)) &&
     (_Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<SyntaxTree>const*,std::vector<std::shared_ptr<SyntaxTree>,std::allocator<std::shared_ptr<SyntaxTree>>>>,__gnu_cxx::__ops::_Iter_pred<format_error<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&>(Options_const&,char_const*,SyntaxTree_const&,char_const*,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&)::_lambda(std::shared_ptr<SyntaxTree>const&)_1_>>
                        ((context_->childs).
                         super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (context_->childs).
                         super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish),
     _Var2._M_current !=
     (context_->childs).
     super__Vector_base<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>.
     _M_impl.super__Vector_impl_data._M_finish)) {
    context_ = ((_Var2._M_current)->super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
  }
  SyntaxTree::token_stream((SyntaxTree *)local_70);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
  }
  else {
    iVar1 = *(_Atomic_word *)(local_70._8_8_ + 8);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
    if (iVar1 != 0) {
      wVar3 = SyntaxTree::token_stream((SyntaxTree *)local_70);
      std::__shared_ptr<const_TokenStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_58,(SyntaxTree *)local_70,
                 wVar3.super___weak_ptr<const_TokenStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi._M_pi);
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 8));
      SyntaxTree::get_token(&local_48,context_);
      local_70._0_8_ = &(local_58._M_ptr)->text;
      local_70._8_8_ = local_48.begin;
      local_70._16_8_ = local_48.end;
      format_error<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&>
                (__return_storage_ptr__,opt,type,(TokenInfo *)local_70,msg,args);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
      return __return_storage_ptr__;
    }
  }
  format_error<>(__return_storage_ptr__,opt,"fatal error",
                 "context->token_stream() == nullptr during format_error");
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_error(const Options& opt, const char* type, const SyntaxTree& context_, const char* msg, Args&&... args)
{
    const SyntaxTree* context = &context_;

    if(!context->has_text())
    {
        auto it = std::find_if(context->begin(), context->end(), [](const shared_ptr<SyntaxTree>& child) {
            return child->has_text();
        });
        context = (it == context->end())? context : it->get();
    }

    if(context->token_stream().use_count() == 0)
    {
        return format_error(opt, "fatal error", nocontext, "context->token_stream() == nullptr during format_error");
    }
    else
    {
        auto tstream = context->token_stream().lock();
        return format_error(opt, type, TokenStream::TokenInfo(tstream->text, context->get_token()), msg, std::forward<Args>(args)...);
    }
}